

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O0

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::drop_subscription
          (storage_t *this,mbox_t *mbox,type_index *msg_type,state_t *target_state)

{
  bool bVar1;
  int iVar2;
  abstract_message_box_t *paVar3;
  undefined4 extraout_var;
  agent_t *paVar4;
  iterator iStack_40;
  bool must_unsubscribe_mbox;
  mbox_id_t local_38;
  _Self local_30;
  iterator existed_position;
  state_t *target_state_local;
  type_index *msg_type_local;
  mbox_t *mbox_local;
  storage_t *this_local;
  
  existed_position._M_node = (_Base_ptr)target_state;
  paVar3 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(mbox);
  iVar2 = (*paVar3->_vptr_abstract_message_box_t[2])();
  local_38 = CONCAT44(extraout_var,iVar2);
  local_30._M_node =
       (_Base_ptr)
       map_based_subscr_storage::(anonymous_namespace)::
       find<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>>
                 (&this->m_events,&local_38,msg_type,existed_position._M_node);
  iStack_40 = std::
              map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
              ::end(&this->m_events);
  bVar1 = std::operator!=(&local_30,&stack0xffffffffffffffc0);
  if (bVar1) {
    bVar1 = map_based_subscr_storage::(anonymous_namespace)::
            is_known_mbox_msg_pair<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>,std::_Rb_tree_iterator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
                      (&this->m_events,
                       (_Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
                        )local_30._M_node);
    std::
    map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
    ::erase_abi_cxx11_((map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
                        *)&this->m_events,(iterator)local_30._M_node);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      paVar3 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(mbox);
      paVar4 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      (*paVar3->_vptr_abstract_message_box_t[4])(paVar3,msg_type,paVar4);
    }
  }
  return;
}

Assistant:

void
storage_t::drop_subscription(
	const mbox_t & mbox,
	const std::type_index & msg_type,
	const state_t & target_state )
	{
		auto existed_position = find(
				m_events, mbox->id(), msg_type, target_state );
		if( existed_position != m_events.end() )
			{
				// Note v.5.5.9 unsubscribe_event_handlers is called for
				// mbox even if it is MPSC mbox. It is necessary for the case
				// of message delivery tracing.

				// We must destroy mbox subscription in case if the agent has no
				// more subscriptions for that mbox+msg_type pair.
				// Detect this while existed_position is not invalidated.
				bool must_unsubscribe_mbox =
						!is_known_mbox_msg_pair( m_events, existed_position );

				m_events.erase( existed_position );

				if( must_unsubscribe_mbox )
					{
						mbox->unsubscribe_event_handlers( msg_type, owner() );
					}
			}
	}